

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidSplitNdWrongNumSplits(void)

{
  RepeatedField<long> *pRVar1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  uint uVar2;
  Rep *pRVar3;
  ulong uVar4;
  bool bVar5;
  FeatureType *pFVar6;
  long *plVar7;
  FeatureDescription *pFVar8;
  ArrayFeatureType *pAVar9;
  NeuralNetworkLayer *pNVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  Tensor *obj;
  void *pvVar12;
  LayerUnion LVar13;
  ostream *poVar14;
  string *psVar15;
  long lVar16;
  undefined8 *puVar17;
  int iVar18;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar19;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  Arena *pAVar20;
  uint uVar21;
  Model m;
  Result res1;
  Model local_80;
  Result local_50;
  
  CoreML::Specification::Model::Model(&local_80,(Arena *)0x0,false);
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar20 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar20);
  }
  pRVar3 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_001929a2:
    pRVar19 = &(local_80.description_)->input_;
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar19->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar19->super_RepeatedPtrFieldBase,pFVar8);
  }
  else {
    iVar18 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar18) goto LAB_001929a2;
    ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar18 + 1;
    pvVar12 = pRVar3->elements[iVar18];
  }
  puVar17 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),"input",puVar17);
  pFVar6 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar6 == (FeatureType *)0x0) {
    pAVar20 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar20);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    uVar4 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar20);
    (pFVar6->Type_).multiarraytype_ = pAVar9;
  }
  pRVar1 = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  if (uVar2 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 1);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar2] = 3;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar2] = 3;
  }
  uVar21 = uVar2 + 1;
  (pAVar9->shape_).current_size_ = uVar21;
  if (uVar21 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 2);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar21] = 5;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar21] = 5;
  }
  uVar21 = uVar2 + 2;
  (pAVar9->shape_).current_size_ = uVar21;
  if (uVar21 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 3);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar21] = 2;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar21] = 2;
  }
  pRVar1->current_size_ = uVar2 + 3;
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar20 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar20);
  }
  pRVar3 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00192b5f:
    pRVar19 = &(local_80.description_)->output_;
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar19->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar19->super_RepeatedPtrFieldBase,pFVar8);
  }
  else {
    iVar18 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar18) goto LAB_00192b5f;
    ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar18 + 1;
    pvVar12 = pRVar3->elements[iVar18];
  }
  puVar17 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),"output",puVar17);
  pFVar6 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar6 == (FeatureType *)0x0) {
    pAVar20 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar20);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    uVar4 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar20);
    (pFVar6->Type_).multiarraytype_ = pAVar9;
  }
  pRVar1 = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  if (uVar2 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 1);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar2] = 3;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar2] = 3;
  }
  uVar21 = uVar2 + 1;
  (pAVar9->shape_).current_size_ = uVar21;
  if (uVar21 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 2);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar21] = 5;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar21] = 5;
  }
  uVar21 = uVar2 + 2;
  (pAVar9->shape_).current_size_ = uVar21;
  if (uVar21 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 3);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar21] = 2;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar21] = 2;
  }
  pRVar1->current_size_ = uVar2 + 3;
  if (local_80._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_80);
    local_80._oneof_case_[0] = 500;
    pAVar20 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    local_80.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar20);
  }
  (local_80.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pRVar3 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_80.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00192d3c:
    this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(local_80.Type_.pipeline_)->models_;
    pNVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar10 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar10);
  }
  else {
    iVar18 = (local_80.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar3->allocated_size <= iVar18) goto LAB_00192d3c;
    (local_80.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar18 + 1;
    pNVar10 = (NeuralNetworkLayer *)pRVar3->elements[iVar18];
  }
  pRVar3 = (pNVar10->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00192d74:
    pbVar11 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar10->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar10->input_).super_RepeatedPtrFieldBase,pbVar11);
  }
  else {
    iVar18 = (pNVar10->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar18) goto LAB_00192d74;
    (pNVar10->input_).super_RepeatedPtrFieldBase.current_size_ = iVar18 + 1;
    pvVar12 = pRVar3->elements[iVar18];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x3a8ef3);
  this = &pNVar10->output_;
  pRVar3 = (pNVar10->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00192dc8:
    pbVar11 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((this->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&this->super_RepeatedPtrFieldBase,pbVar11);
  }
  else {
    iVar18 = (pNVar10->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar18) goto LAB_00192dc8;
    (pNVar10->output_).super_RepeatedPtrFieldBase.current_size_ = iVar18 + 1;
    pvVar12 = pRVar3->elements[iVar18];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x397ddf);
  pRVar3 = (pNVar10->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00192e14:
    pbVar11 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((this->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&this->super_RepeatedPtrFieldBase,pbVar11);
  }
  else {
    iVar18 = (pNVar10->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar18) goto LAB_00192e14;
    (pNVar10->output_).super_RepeatedPtrFieldBase.current_size_ = iVar18 + 1;
    pvVar12 = pRVar3->elements[iVar18];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x397de7);
  pRVar3 = (pNVar10->inputtensor_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00192e60:
    obj = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Tensor>
                    ((pNVar10->inputtensor_).super_RepeatedPtrFieldBase.arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar10->inputtensor_).super_RepeatedPtrFieldBase,obj);
  }
  else {
    iVar18 = (pNVar10->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar18) goto LAB_00192e60;
    (pNVar10->inputtensor_).super_RepeatedPtrFieldBase.current_size_ = iVar18 + 1;
    pvVar12 = pRVar3->elements[iVar18];
  }
  *(undefined4 *)((long)pvVar12 + 0x24) = 3;
  if (pNVar10->_oneof_case_[0] == 0x3cf) {
    LVar13 = pNVar10->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar10);
    pNVar10->_oneof_case_[0] = 0x3cf;
    uVar4 = (pNVar10->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    LVar13.splitnd_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::SplitNDLayerParams>
                   (pAVar20);
    (pNVar10->layer_).splitnd_ = (SplitNDLayerParams *)LVar13;
  }
  (LVar13.batchnorm_)->channels_ = 5;
  CoreML::validate<(MLModelType)500>(&local_50,&local_80);
  bVar5 = CoreML::Result::good(&local_50);
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x152c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"!((res1).good())",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
  }
  else {
    psVar15 = CoreML::Result::message_abi_cxx11_(&local_50);
    iVar18 = 0;
    lVar16 = std::__cxx11::string::find((char *)psVar15,0x397e24,0);
    if (lVar16 != -1) goto LAB_0019305e;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x152d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"res1.message().find(\"match\") != std::string::npos",0x31);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
  }
  std::ostream::put((char)poVar14);
  iVar18 = 1;
  std::ostream::flush();
LAB_0019305e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_message._M_dataplus._M_p != &local_50.m_message.field_2) {
    operator_delete(local_50.m_message._M_dataplus._M_p,
                    local_50.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_80);
  return iVar18;
}

Assistant:

int testInvalidSplitNdWrongNumSplits() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output1");
    layers->add_output("output2");
    layers->add_inputtensor()->set_rank(3);

    // missing required parameters
    auto *params = layers->mutable_splitnd();
    params->set_numsplits(5);

    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("match") != std::string::npos);

    return 0;

}